

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

LibraryIncDirClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LibraryIncDirClauseSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::FilePathSpecSyntax>const&>
          (BumpAllocator *this,Token *args,Token *args_1,
          SeparatedSyntaxList<slang::syntax::FilePathSpecSyntax> *args_2)

{
  Token minus;
  Token incdir;
  LibraryIncDirClauseSyntax *this_00;
  
  this_00 = (LibraryIncDirClauseSyntax *)allocate(this,0x70,8);
  minus.kind = args->kind;
  minus._2_1_ = args->field_0x2;
  minus.numFlags.raw = (args->numFlags).raw;
  minus.rawLen = args->rawLen;
  minus.info = args->info;
  incdir.kind = args_1->kind;
  incdir._2_1_ = args_1->field_0x2;
  incdir.numFlags.raw = (args_1->numFlags).raw;
  incdir.rawLen = args_1->rawLen;
  incdir.info = args_1->info;
  slang::syntax::LibraryIncDirClauseSyntax::LibraryIncDirClauseSyntax(this_00,minus,incdir,args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }